

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

void __thiscall
PruneReplayer::access_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
  *this_01;
  int *piVar1;
  PruneReplayer *this_02;
  const_iterator cVar2;
  iterator iVar3;
  ulong uVar4;
  long lVar5;
  VkBaseInStructure *sin;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  PruneReplayer *local_48;
  VkRenderPass local_40;
  Hash local_38;
  
  this_00 = &this->accessed_graphics_pipelines;
  local_38 = hash;
  cVar2 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&local_38);
  if (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    local_50 = &this_00->_M_h;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&local_38);
    access_pipeline_layout(this,(Hash)create_info->layout);
    if (create_info->renderPass != (VkRenderPass)0x0) {
      local_50 = &(this->accessed_render_passes)._M_h;
      local_40 = create_info->renderPass;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ();
    }
    local_48 = this;
    if (create_info->stageCount != 0) {
      lVar5 = 0x18;
      uVar4 = 0;
      do {
        local_40 = *(VkRenderPass *)((long)&create_info->pStages->sType + lVar5);
        local_50 = &(this->accessed_shader_modules)._M_h;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->accessed_shader_modules,&local_40,&local_50);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar4 < create_info->stageCount);
    }
    this_02 = local_48;
    for (piVar1 = (int *)create_info->pNext; piVar1 != (int *)0x0; piVar1 = *(int **)(piVar1 + 2)) {
      if (*piVar1 == 0x3b9f36d0) {
        if (piVar1[4] == 0) {
          return;
        }
        this_01 = &local_48->library_graphics_pipelines;
        uVar4 = 0;
        do {
          local_50 = *(_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       **)(*(long *)(piVar1 + 6) + uVar4 * 8);
          iVar3 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this_01->_M_h,(key_type *)&local_50);
          if (iVar3.
              super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
              ._M_cur != (__node_type *)0x0) {
            access_graphics_pipeline
                      (this_02,*(Hash *)((long)iVar3.
                                               super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                                               ._M_cur + 8),
                       *(VkGraphicsPipelineCreateInfo **)
                        ((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                               ._M_cur + 0x10));
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (uint)piVar1[4]);
        return;
      }
    }
  }
  return;
}

Assistant:

void access_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info)
	{
		if (accessed_graphics_pipelines.count(hash))
			return;
		accessed_graphics_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		if (create_info->renderPass != VK_NULL_HANDLE)
			accessed_render_passes.insert((Hash) create_info->renderPass);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		auto *library_info =
				find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
				                                           create_info->pNext);

		if (library_info)
		{
			for (uint32_t i = 0; i < library_info->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_graphics_pipelines.find((Hash) library_info->pLibraries[i]);
				if (lib_itr != library_graphics_pipelines.end())
					access_graphics_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}